

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O3

void undo_delete_line(Am_Object *line,Am_Object *obj,bool vis)

{
  ushort uVar1;
  char cVar2;
  uint uVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ushort uVar6;
  Am_Object o2;
  Am_Object AStack_38;
  Am_Object local_30;
  ushort uVar7;
  
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    uVar6 = (ushort)line;
    uVar7 = (ushort)&AStack_38;
    if (vis) {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0x170);
      Am_Object::Am_Object(&AStack_38,pAVar4);
      Am_Object::Am_Object(&local_30,line);
      Am_Object::Add_Part((Am_Object_Data *)&AStack_38,SUB81(&local_30,0),1);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&AStack_38);
    }
    else {
      Am_Object::Get_Object(uVar7,(ulong)line);
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_38);
      Am_Object::Set(uVar6,(Am_Wrapper *)0x170,(ulong)pAVar5);
      Am_Object::~Am_Object(&AStack_38);
      Am_Object::Remove_From_Owner();
    }
    pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)INPUT_1);
    Am_Object::Am_Object(&AStack_38,pAVar4);
    uVar1 = INPUT_WAS;
    cVar2 = Am_Object::operator==(&AStack_38,obj);
    if (cVar2 != '\0') {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)OUTPUT_1);
      Am_Object::operator=(&AStack_38,pAVar4);
      uVar1 = OUTPUT_WAS;
    }
    pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)uVar1);
    uVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if (OUTPUT_1 == (Am_Slot_Key)uVar3) {
      line_for_list(&AStack_38,line,!vis);
    }
    else if (vis) {
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(line);
      Am_Object::Set(uVar7,(Am_Wrapper *)(ulong)(uVar3 & 0xffff),(ulong)pAVar5);
    }
    else {
      Am_Object::Set(uVar7,uVar3 & 0xffff,0);
    }
    Am_Object::~Am_Object(&AStack_38);
  }
  return;
}

Assistant:

void undo_delete_line(Am_Object &line, Am_Object& obj, bool vis) {
  if (line.Valid()) {
    // line.Set(Am_VISIBLE, vis);
    if (vis) {
      Am_Object owner = line.Get(Am_SAVED_OLD_OWNER);
      owner.Add_Part(line);
    }
    else {
      line.Set(Am_SAVED_OLD_OWNER, line.Get_Owner(), Am_OK_IF_NOT_THERE);
      line.Remove_From_Owner();
    }
    Am_Object o2 = line.Get(INPUT_1);
    Am_Slot_Key slot = INPUT_WAS;
    if (o2 == obj) {
      o2 = line.Get(OUTPUT_1);
      slot = OUTPUT_WAS;
    }
    Am_Slot_Key where_in_o2 = (int)line.Get(slot);
    if (where_in_o2 == OUTPUT_1) line_for_list(o2, line, !vis);
    else {
      if (vis) o2.Set(where_in_o2, line);
      else o2.Set(where_in_o2, 0);
    }
  }
}